

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void __thiscall CEditor::Reset(CEditor *this,bool CreateDefault)

{
  byte bVar1;
  byte in_SIL;
  long in_RDI;
  CEditorMap *in_stack_00000030;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  CEditorMap::Clean((CEditorMap *)(CONCAT17(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffffffffffff));
  if ((bVar1 & 1) != 0) {
    CEditorMap::CreateDefault(in_stack_00000030);
  }
  *(undefined4 *)(in_RDI + 0x10d4) = 0;
  *(undefined4 *)(in_RDI + 0x10d8) = 0;
  *(undefined4 *)(in_RDI + 0x10dc) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x10e0) = 0;
  *(undefined4 *)(in_RDI + 0x10e4) = 0;
  *(undefined4 *)(in_RDI + 0x10f0) = 0;
  *(undefined4 *)(in_RDI + 0x1084) = 0;
  *(undefined4 *)(in_RDI + 0x1088) = 0;
  *(undefined4 *)(in_RDI + 0x108c) = 0;
  *(undefined4 *)(in_RDI + 0x1090) = 0;
  *(undefined4 *)(in_RDI + 0x1094) = 0x3f800000;
  *(undefined4 *)(in_RDI + 0x1098) = 200;
  *(undefined4 *)(in_RDI + 0x10a0) = 0;
  *(undefined4 *)(in_RDI + 0x10a4) = 0;
  *(undefined4 *)(in_RDI + 0x10a8) = 0;
  *(undefined4 *)(in_RDI + 0x10ac) = 0;
  *(undefined1 *)(in_RDI + 0x1248) = 0;
  *(undefined4 *)(in_RDI + 0x10cc) = 0;
  return;
}

Assistant:

void CEditor::Reset(bool CreateDefault)
{
	m_Map.Clean();

	// create default layers
	if(CreateDefault)
		m_Map.CreateDefault();

	m_SelectedLayer = 0;
	m_SelectedGroup = 0;
	m_SelectedQuad = -1;
	m_SelectedPoints = 0;
	m_SelectedEnvelope = 0;
	m_SelectedImage = 0;

	m_WorldOffsetX = 0;
	m_WorldOffsetY = 0;
	m_EditorOffsetX = 0.0f;
	m_EditorOffsetY = 0.0f;

	m_WorldZoom = 1.0f;
	m_ZoomLevel = 200;

	m_MouseDeltaX = 0;
	m_MouseDeltaY = 0;
	m_MouseDeltaWx = 0;
	m_MouseDeltaWy = 0;

	m_Map.m_Modified = false;

	m_ShowEnvelopePreview = SHOWENV_NONE;
}